

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O0

int add_sub_const_insn_p(gen_ctx_t gen_ctx,MIR_insn_t insn,int64_t *val)

{
  MIR_item_t pMVar1;
  MIR_module_t pMVar2;
  char *pcVar3;
  MIR_item_t_conflict local_48;
  MIR_func_t func;
  bb_insn_t_conflict def_bb_insn;
  ssa_edge_t_conflict ssa_edge;
  int64_t *val_local;
  MIR_insn_t insn_local;
  gen_ctx_t gen_ctx_local;
  
  if (((((int)*(undefined8 *)&insn->field_0x18 == 0x22) ||
       ((int)*(undefined8 *)&insn->field_0x18 == 0x27)) ||
      ((int)*(undefined8 *)&insn->field_0x18 == 0x23)) ||
     ((int)*(undefined8 *)&insn->field_0x18 == 0x28)) {
    pMVar1 = insn[1].ops[0].u.ref;
    if ((pMVar1 == (MIR_item_t)0x0) || (pMVar2 = pMVar1->module, *(char *)&pMVar2->name == '\0')) {
      gen_ctx_local._4_4_ = 0;
    }
    else {
      if ((((ulong)insn[1].insn_link.prev & 0xff) == 2) &&
         (pcVar3 = MIR_reg_hard_reg_name
                             (gen_ctx->ctx,*(int *)&insn[1].insn_link.next - 0x21,
                              (gen_ctx->curr_func_item->u).func), pcVar3 != (char *)0x0)) {
        return 0;
      }
      if (((int)*(undefined8 *)&insn->field_0x18 == 0x27) ||
         ((int)*(undefined8 *)&insn->field_0x18 == 0x28)) {
        local_48 = (MIR_item_t_conflict)-(long)(pMVar2->items).tail;
      }
      else {
        local_48 = (pMVar2->items).tail;
      }
      *val = (int64_t)local_48;
      gen_ctx_local._4_4_ = 1;
    }
  }
  else {
    gen_ctx_local._4_4_ = 0;
  }
  return gen_ctx_local._4_4_;
}

Assistant:

static int add_sub_const_insn_p (gen_ctx_t gen_ctx, MIR_insn_t insn, int64_t *val) {
  ssa_edge_t ssa_edge;
  bb_insn_t def_bb_insn;
  // ??? , minimal gvn->val
  if (insn->code != MIR_ADD && insn->code != MIR_SUB && insn->code != MIR_ADDS
      && insn->code != MIR_SUBS)
    return FALSE;
  if ((ssa_edge = insn->ops[2].data) == NULL || !(def_bb_insn = ssa_edge->def)->gvn_val_const_p)
    return FALSE;
  MIR_func_t func = curr_func_item->u.func;
  if (insn->ops[1].mode == MIR_OP_VAR
      && MIR_reg_hard_reg_name (gen_ctx->ctx, insn->ops[1].u.var - MAX_HARD_REG, func) != NULL)
    return FALSE;
  *val = insn->code == MIR_SUB || insn->code == MIR_SUBS ? -def_bb_insn->gvn_val
                                                         : def_bb_insn->gvn_val;
  return TRUE;
}